

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::internal::format_decimal<unsigned_int,wchar_t,fmt::internal::ThousandsSep>
               (wchar_t *buffer,uint value,uint num_digits,ThousandsSep thousands_sep)

{
  ulong uVar1;
  uint uVar2;
  wchar_t wVar3;
  wchar_t *local_38;
  
  local_38 = buffer + num_digits;
  uVar1 = (ulong)value;
  while( true ) {
    uVar2 = (uint)uVar1;
    if (uVar2 < 100) break;
    local_38[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(uVar1 % 100) * 2 + 1];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    local_38[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(uVar1 % 100) * 2];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    uVar1 = uVar1 / 100;
  }
  if (uVar2 < 10) {
    wVar3 = uVar2 | 0x30;
  }
  else {
    local_38[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(uVar1 * 2 & 0xffffffff) + 1];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    wVar3 = (wchar_t)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar1 * 2];
  }
  local_38[-1] = wVar3;
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits,
                           ThousandsSep thousands_sep) {
  buffer += num_digits;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = Data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = Data::DIGITS[index];
}